

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O1

int Acb_ObjAlloc(Acb_Ntk_t *p,Acb_ObjType_t Type,int nFans,int nFons)

{
  uint uVar1;
  uint Entry;
  Vec_Que_t *pVVar2;
  char *pcVar3;
  word *pwVar4;
  float *pfVar5;
  int iVar6;
  int Entry_00;
  Vec_Int_t *p_00;
  int iVar7;
  size_t __size;
  int iVar8;
  
  uVar1 = (p->vObjType).nCap;
  Entry = (p->vObjType).nSize;
  if (Entry == uVar1) {
    if ((int)uVar1 < 0x10) {
      pcVar3 = (p->vObjType).pArray;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(pcVar3,0x10);
      }
      (p->vObjType).pArray = pcVar3;
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar1 * 2;
      if ((int)__size <= (int)uVar1) goto LAB_0038d106;
      pcVar3 = (p->vObjType).pArray;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)malloc(__size);
      }
      else {
        pcVar3 = (char *)realloc(pcVar3,__size);
      }
      (p->vObjType).pArray = pcVar3;
    }
    (p->vObjType).nCap = (int)__size;
  }
LAB_0038d106:
  iVar6 = (p->vObjType).nSize;
  (p->vObjType).nSize = iVar6 + 1;
  (p->vObjType).pArray[iVar6] = (char)Type;
  if (Type == ABC_OPER_CO) {
    if (nFans != 1) {
      __assert_fail("nFans == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0x1da,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
    }
    p_00 = &p->vCos;
    iVar6 = (p->vCos).nSize;
LAB_0038d148:
    Vec_IntPush(p_00,Entry);
    iVar7 = 2;
  }
  else {
    if (Type == ABC_OPER_CI) {
      if (nFans != 0) {
        __assert_fail("nFans == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x1d3,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
      }
      p_00 = &p->vCis;
      iVar6 = (p->vCis).nSize;
      goto LAB_0038d148;
    }
    if ((int)Entry < 1) goto LAB_0038d4ce;
    if ((p->vObjType).nSize <= (int)Entry) goto LAB_0038d4ed;
    iVar7 = (uint)((p->vObjType).pArray[Entry] == '\x06') + nFans;
    if (iVar7 <= p->nFaninMax) {
      iVar7 = p->nFaninMax;
    }
    iVar6 = -1;
  }
  Vec_IntPush(&p->vObjFans,(p->vFanSto).nSize);
  Vec_IntPush(&p->vFanSto,0);
  if (0 < iVar7) {
    iVar8 = 0;
    if (iVar6 < 0) {
      iVar6 = -1;
      iVar8 = 0;
    }
    do {
      Entry_00 = -1;
      if (iVar8 == 1) {
        Entry_00 = iVar6;
      }
      Vec_IntPush(&p->vFanSto,Entry_00);
      iVar8 = iVar8 + 1;
    } while (iVar7 != iVar8);
  }
  if ((int)Entry < 1) {
LAB_0038d4ce:
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= (int)Entry) {
LAB_0038d4ed:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if ((p->vObjType).pArray[Entry] == '\x06') {
    __assert_fail("!Acb_ObjIsBox(p, iObj) || nFons > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x1e7,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
  }
  if (0 < (p->vObjCopy).nSize) {
    Vec_IntPush(&p->vObjCopy,-1);
  }
  if (0 < (p->vObjFunc).nSize) {
    Vec_IntPush(&p->vObjFunc,-1);
  }
  if (0 < (p->vObjWeight).nSize) {
    Vec_IntPush(&p->vObjWeight,0);
  }
  if (0 < (p->vObjTruth).nSize) {
    uVar1 = (p->vObjTruth).nCap;
    if ((p->vObjTruth).nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        pwVar4 = (p->vObjTruth).pArray;
        if (pwVar4 == (word *)0x0) {
          pwVar4 = (word *)malloc(0x80);
        }
        else {
          pwVar4 = (word *)realloc(pwVar4,0x80);
        }
        (p->vObjTruth).pArray = pwVar4;
        iVar6 = 0x10;
      }
      else {
        iVar6 = uVar1 * 2;
        if (iVar6 <= (int)uVar1) goto LAB_0038d2e4;
        pwVar4 = (p->vObjTruth).pArray;
        if (pwVar4 == (word *)0x0) {
          pwVar4 = (word *)malloc((ulong)uVar1 << 4);
        }
        else {
          pwVar4 = (word *)realloc(pwVar4,(ulong)uVar1 << 4);
        }
        (p->vObjTruth).pArray = pwVar4;
      }
      if (pwVar4 == (word *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
      }
      (p->vObjTruth).nCap = iVar6;
    }
LAB_0038d2e4:
    iVar6 = (p->vObjTruth).nSize;
    (p->vObjTruth).nSize = iVar6 + 1;
    (p->vObjTruth).pArray[iVar6] = 0;
  }
  if (0 < (p->vObjName).nSize) {
    Vec_IntPush(&p->vObjName,0);
  }
  if (0 < (p->vObjRange).nSize) {
    Vec_IntPush(&p->vObjRange,0);
  }
  if (0 < (p->vObjTrav).nSize) {
    Vec_IntPush(&p->vObjTrav,0);
  }
  if (0 < (p->vObjAttr).nSize) {
    Vec_IntPush(&p->vObjAttr,0);
  }
  if (0 < (p->vLevelD).nSize) {
    Vec_IntPush(&p->vLevelD,0);
  }
  if (0 < (p->vLevelR).nSize) {
    Vec_IntPush(&p->vLevelR,0);
  }
  if (0 < (p->vPathD).nSize) {
    Vec_IntPush(&p->vPathD,0);
  }
  if (0 < (p->vPathR).nSize) {
    Vec_IntPush(&p->vPathR,0);
  }
  if ((p->vCounts).nSize < 1) goto LAB_0038d473;
  uVar1 = (p->vCounts).nCap;
  if ((p->vCounts).nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      pfVar5 = (p->vCounts).pArray;
      if (pfVar5 == (float *)0x0) {
        pfVar5 = (float *)malloc(0x40);
      }
      else {
        pfVar5 = (float *)realloc(pfVar5,0x40);
      }
      (p->vCounts).pArray = pfVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar1 * 2;
      if (iVar6 <= (int)uVar1) goto LAB_0038d454;
      pfVar5 = (p->vCounts).pArray;
      if (pfVar5 == (float *)0x0) {
        pfVar5 = (float *)malloc((ulong)uVar1 << 3);
      }
      else {
        pfVar5 = (float *)realloc(pfVar5,(ulong)uVar1 << 3);
      }
      (p->vCounts).pArray = pfVar5;
    }
    (p->vCounts).nCap = iVar6;
  }
LAB_0038d454:
  iVar6 = (p->vCounts).nSize;
  (p->vCounts).nSize = iVar6 + 1;
  (p->vCounts).pArray[iVar6] = 0.0;
LAB_0038d473:
  if (0 < (p->vFanouts).nSize) {
    Vec_WecPushLevel(&p->vFanouts);
  }
  if (0 < (p->vCnfs).nSize) {
    Vec_WecPushLevel(&p->vCnfs);
  }
  pVVar2 = p->vQue;
  if (pVVar2 != (Vec_Que_t *)0x0) {
    if (pVVar2->pCostsFlt != (float **)0x0) {
      __assert_fail("p->pCostsFlt == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0x61,"void Vec_QueSetPriority(Vec_Que_t *, float **)");
    }
    pVVar2->pCostsFlt = &(p->vCounts).pArray;
  }
  return Entry;
}

Assistant:

static inline int Acb_ObjAlloc( Acb_Ntk_t * p, Acb_ObjType_t Type, int nFans, int nFons )
{
    int i, nFansReal, CioId = -1, iObj = Vec_StrSize(&p->vObjType);
    Vec_StrPush( &p->vObjType, (char)Type );
    if ( Type == ABC_OPER_CI )
    {
        assert( nFans == 0 );
        CioId = Vec_IntSize( &p->vCis );
        Vec_IntPush( &p->vCis, iObj );
        nFansReal = 2;
    }
    else if ( Type == ABC_OPER_CO )
    {
        assert( nFans == 1 );
        CioId = Vec_IntSize( &p->vCos );
        Vec_IntPush( &p->vCos, iObj );
        nFansReal = 2;
    }
    else 
        nFansReal = Abc_MaxInt( nFans + Acb_ObjIsBox(p, iObj), p->nFaninMax );
    // add fins
    Vec_IntPush( &p->vObjFans, Vec_IntSize(&p->vFanSto) );
    Vec_IntPush( &p->vFanSto, 0 );
    for ( i = 0; i < nFansReal; i++ )
        Vec_IntPush( &p->vFanSto, (CioId >= 0 && i == 1) ? CioId : -1 );
    // add fons
    assert( !Acb_ObjIsBox(p, iObj) || nFons > 0 );
    for ( i = 0; i < nFons; i++ )
        Acb_ObjAddFanin( p, Acb_ObjAlloc(p, ABC_OPER_FON, 1, 0), iObj );
    // extend storage
    if ( Acb_NtkHasObjCopies(p) ) Vec_IntPush(&p->vObjCopy  , -1);
    if ( Acb_NtkHasObjFuncs(p)  ) Vec_IntPush(&p->vObjFunc  , -1);
    if ( Acb_NtkHasObjWeights(p)) Vec_IntPush(&p->vObjWeight,  0);
    if ( Acb_NtkHasObjTruths(p) ) Vec_WrdPush(&p->vObjTruth ,  0);
    if ( Acb_NtkHasObjNames(p)  ) Vec_IntPush(&p->vObjName  ,  0);
    if ( Acb_NtkHasObjRanges(p) ) Vec_IntPush(&p->vObjRange ,  0);
    if ( Acb_NtkHasObjTravs(p)  ) Vec_IntPush(&p->vObjTrav  ,  0);
    if ( Acb_NtkHasObjAttrs(p)  ) Vec_IntPush(&p->vObjAttr  ,  0);
    if ( Acb_NtkHasObjLevelD(p) ) Vec_IntPush(&p->vLevelD   ,  0);
    if ( Acb_NtkHasObjLevelR(p) ) Vec_IntPush(&p->vLevelR   ,  0);
    if ( Acb_NtkHasObjPathD(p)  ) Vec_IntPush(&p->vPathD    ,  0);
    if ( Acb_NtkHasObjPathR(p)  ) Vec_IntPush(&p->vPathR    ,  0);
    if ( Acb_NtkHasObjCounts(p) ) Vec_FltPush(&p->vCounts   ,  0);
    if ( Acb_NtkHasObjFanout(p) ) Vec_WecPushLevel(&p->vFanouts);
    if ( Acb_NtkHasObjCnfs(p)   ) Vec_WecPushLevel(&p->vCnfs);
    if ( p->vQue ) Vec_QueSetPriority( p->vQue, Vec_FltArrayP(&p->vCounts) );
    return iObj;
}